

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  int v1;
  undefined8 *puVar1;
  void **ppvVar2;
  Nullable<const_char_*> failure_msg;
  long lVar3;
  LogMessageFatal LStack_28;
  
  v1 = this->current_size_;
  ppvVar2 = elements(this);
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl(v1,0,"n > 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    lVar3 = 0;
    do {
      puVar1 = (undefined8 *)ppvVar2[lVar3];
      puVar1[1] = 0;
      lVar3 = lVar3 + 1;
      *(undefined1 *)*puVar1 = 0;
    } while (lVar3 < v1);
    this->current_size_ = 0;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x2ca,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }